

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  int32_t iVar4;
  uint32_t uVar5;
  CppStringType CVar6;
  Reflection *pRVar7;
  Descriptor *actual;
  Descriptor *pDVar8;
  ExtensionSet *this_00;
  int64_t iVar9;
  long *plVar10;
  uint *puVar11;
  uint64_t uVar12;
  unsigned_long *puVar13;
  float *pfVar14;
  double *pdVar15;
  bool *pbVar16;
  EnumValueDescriptor *this_01;
  int *piVar17;
  Cord *pCVar18;
  InlinedStringField *this_02;
  Arena *arena;
  MicroString *pMVar19;
  ArenaStringPtr *this_03;
  Message **ppMVar20;
  RepeatedField<long> *this_04;
  RepeatedField<unsigned_int> *this_05;
  RepeatedField<unsigned_long> *this_06;
  RepeatedField<double> *this_07;
  RepeatedField<float> *this_08;
  RepeatedField<bool> *this_09;
  RepeatedField<int> *pRVar21;
  RepeatedField<absl::lts_20250127::Cord> *this_10;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_11;
  MapFieldBase *this_12;
  RepeatedPtrFieldBase *this_13;
  float fVar22;
  double dVar23;
  string_view sVar24;
  ArenaStringPtr *str;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar7 = Message::GetReflection(message);
  if (this != pRVar7) {
    pDVar8 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar8,actual,field,"ClearField");
  }
  pDVar8 = FieldDescriptor::containing_type(field);
  if (pDVar8 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    iVar2 = FieldDescriptor::number(field);
    internal::ExtensionSet::ClearExtension(this_00,iVar2);
    return;
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    CVar3 = FieldDescriptor::cpp_type(field);
    switch(CVar3) {
    case CPPTYPE_INT32:
      pRVar21 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::Clear(pRVar21);
      break;
    case CPPTYPE_INT64:
      this_04 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      RepeatedField<long>::Clear(this_04);
      break;
    case CPPTYPE_UINT32:
      this_05 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      RepeatedField<unsigned_int>::Clear(this_05);
      break;
    case CPPTYPE_UINT64:
      this_06 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      RepeatedField<unsigned_long>::Clear(this_06);
      break;
    case CPPTYPE_DOUBLE:
      this_07 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      RepeatedField<double>::Clear(this_07);
      break;
    case CPPTYPE_FLOAT:
      this_08 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      RepeatedField<float>::Clear(this_08);
      break;
    case CPPTYPE_BOOL:
      this_09 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      RepeatedField<bool>::Clear(this_09);
      break;
    case CPPTYPE_ENUM:
      pRVar21 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::Clear(pRVar21);
      break;
    case CPPTYPE_STRING:
      CVar6 = FieldDescriptor::cpp_string_type(field);
      if (CVar6 != kView) {
        if (CVar6 == kCord) {
          this_10 = MutableRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                              (this,message,field);
          RepeatedField<absl::lts_20250127::Cord>::Clear(this_10);
          return;
        }
        if (CVar6 != kString) {
          return;
        }
      }
      this_11 = MutableRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          (this,message,field);
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Clear(this_11);
      break;
    case CPPTYPE_MESSAGE:
      bVar1 = anon_unknown_6::IsMapFieldInApi(field);
      if (bVar1) {
        this_12 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        internal::MapFieldBase::Clear(this_12);
      }
      else {
        this_13 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(this_13);
      }
    }
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar1) {
      ClearOneofField(this,message,field);
    }
    else {
      bVar1 = HasFieldSingular(this,message,field);
      if (bVar1) {
        ClearHasBit(this,message,field);
        CVar3 = FieldDescriptor::cpp_type(field);
        switch(CVar3) {
        case CPPTYPE_INT32:
          iVar4 = FieldDescriptor::default_value_int32_t(field);
          piVar17 = MutableRaw<int>(this,message,field);
          *piVar17 = iVar4;
          break;
        case CPPTYPE_INT64:
          iVar9 = FieldDescriptor::default_value_int64_t(field);
          plVar10 = MutableRaw<long>(this,message,field);
          *plVar10 = iVar9;
          break;
        case CPPTYPE_UINT32:
          uVar5 = FieldDescriptor::default_value_uint32_t(field);
          puVar11 = MutableRaw<unsigned_int>(this,message,field);
          *puVar11 = uVar5;
          break;
        case CPPTYPE_UINT64:
          uVar12 = FieldDescriptor::default_value_uint64_t(field);
          puVar13 = MutableRaw<unsigned_long>(this,message,field);
          *puVar13 = uVar12;
          break;
        case CPPTYPE_DOUBLE:
          dVar23 = FieldDescriptor::default_value_double(field);
          pdVar15 = MutableRaw<double>(this,message,field);
          *pdVar15 = dVar23;
          break;
        case CPPTYPE_FLOAT:
          fVar22 = FieldDescriptor::default_value_float(field);
          pfVar14 = MutableRaw<float>(this,message,field);
          *pfVar14 = fVar22;
          break;
        case CPPTYPE_BOOL:
          bVar1 = FieldDescriptor::default_value_bool(field);
          pbVar16 = MutableRaw<bool>(this,message,field);
          *pbVar16 = bVar1;
          break;
        case CPPTYPE_ENUM:
          this_01 = FieldDescriptor::default_value_enum(field);
          iVar2 = EnumValueDescriptor::number(this_01);
          piVar17 = MutableRaw<int>(this,message,field);
          *piVar17 = iVar2;
          break;
        case CPPTYPE_STRING:
          CVar6 = FieldDescriptor::cpp_string_type(field);
          if (CVar6 != kView) {
            if (CVar6 == kCord) {
              bVar1 = FieldDescriptor::has_default_value(field);
              if (!bVar1) {
                pCVar18 = MutableRaw<absl::lts_20250127::Cord>(this,message,field);
                absl::lts_20250127::Cord::Clear(pCVar18);
                return;
              }
              sVar24 = FieldDescriptor::default_value_string(field);
              pCVar18 = MutableRaw<absl::lts_20250127::Cord>(this,message,field);
              absl::lts_20250127::Cord::operator=(pCVar18,sVar24);
              return;
            }
            if (CVar6 != kString) {
              return;
            }
          }
          bVar1 = IsInlined(this,field);
          if (bVar1) {
            this_02 = MutableRaw<google::protobuf::internal::InlinedStringField>(this,message,field)
            ;
            internal::InlinedStringField::ClearToEmpty(this_02);
          }
          else {
            bVar1 = IsMicroString(this,field);
            if (bVar1) {
              bVar1 = FieldDescriptor::has_default_value(field);
              if (bVar1) {
                pMVar19 = MutableRaw<google::protobuf::internal::MicroString>(this,message,field);
                sVar24 = FieldDescriptor::default_value_string(field);
                arena = MessageLite::GetArena(&message->super_MessageLite);
                internal::MicroString::Set(pMVar19,sVar24,arena);
              }
              else {
                pMVar19 = MutableRaw<google::protobuf::internal::MicroString>(this,message,field);
                internal::MicroString::Clear(pMVar19);
              }
            }
            else {
              this_03 = MutableRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
              internal::ArenaStringPtr::Destroy(this_03);
              internal::ArenaStringPtr::InitDefault(this_03);
            }
          }
          break;
        case CPPTYPE_MESSAGE:
          ppMVar20 = MutableRaw<google::protobuf::Message*>(this,message,field);
          (*((*ppMVar20)->super_MessageLite)._vptr_MessageLite[2])();
        }
      }
    }
  }
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(ClearField, message);
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (schema_.InRealOneof(field)) {
      ClearOneofField(message, field);
      return;
    }
    if (HasFieldSingular(*message, field)) {
      ClearHasBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32_t);
        CLEAR_TYPE(INT64, int64_t);
        CLEAR_TYPE(UINT32, uint32_t);
        CLEAR_TYPE(UINT64, uint64_t);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (field->has_default_value()) {
                *MutableRaw<absl::Cord>(message, field) =
                    field->default_value_string();
              } else {
                MutableRaw<absl::Cord>(message, field)->Clear();
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                // Currently, string with default value can't be inlined. So we
                // don't have to handle default value here.
                MutableRaw<InlinedStringField>(message, field)->ClearToEmpty();
              } else if (IsMicroString(field)) {
                if (field->has_default_value()) {
                  // TODO: Use an unowned block instead.
                  MutableRaw<MicroString>(message, field)
                      ->Set(field->default_value_string(), message->GetArena());
                } else {
                  MutableRaw<MicroString>(message, field)->Clear();
                }
              } else {
                auto* str = MutableRaw<ArenaStringPtr>(message, field);
                str->Destroy();
                str->InitDefault();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->Clear();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}